

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O1

bool __thiscall DFraggleThinker::wait_finished(DFraggleThinker *this,DRunningScript *script)

{
  int iVar1;
  DRunningScript *pDVar2;
  DSectorEffect *pDVar3;
  byte bVar4;
  sector_t *psVar5;
  uint uVar6;
  DRunningScript *pDVar7;
  bool bVar8;
  FSectorTagIterator itr;
  FSectorTagIterator local_18;
  
  switch(script->wait_type) {
  case 1:
    iVar1 = script->wait_data;
    script->wait_data = iVar1 + -1;
    bVar8 = iVar1 < 2;
    break;
  case 2:
    local_18.searchtag = script->wait_data;
    if (local_18.searchtag == 0) {
      local_18.start = 0;
    }
    else {
      local_18.start = tagManager.TagHashFirst[(byte)local_18.searchtag];
    }
    uVar6 = FSectorTagIterator::Next(&local_18);
    bVar4 = (byte)(uVar6 >> 0x18);
    psVar5 = sectors;
    while (bVar8 = (bool)(bVar4 >> 7), sectors = psVar5, -1 < (int)uVar6) {
      bVar8 = SUB41(uVar6 >> 0x1f,0);
      pDVar3 = psVar5[uVar6].floordata.field_0.p;
      if (pDVar3 != (DSectorEffect *)0x0) {
        if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          return bVar8;
        }
        psVar5[uVar6].floordata.field_0.p = (DSectorEffect *)0x0;
      }
      pDVar3 = psVar5[uVar6].ceilingdata.field_0.p;
      if (pDVar3 != (DSectorEffect *)0x0) {
        if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          return bVar8;
        }
        psVar5[uVar6].ceilingdata.field_0.p = (DSectorEffect *)0x0;
      }
      pDVar3 = psVar5[uVar6].lightingdata.field_0.p;
      if (pDVar3 != (DSectorEffect *)0x0) {
        if (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          return bVar8;
        }
        psVar5[uVar6].lightingdata.field_0.p = (DSectorEffect *)0x0;
      }
      uVar6 = FSectorTagIterator::Next(&local_18);
      bVar4 = (byte)(uVar6 >> 0x18);
      psVar5 = sectors;
    }
    break;
  case 3:
    pDVar7 = (this->RunningScripts).field_0.p;
    if ((pDVar7 != (DRunningScript *)0x0) && (((pDVar7->super_DObject).ObjectFlags & 0x20) != 0)) {
      (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
      pDVar7 = (DRunningScript *)0x0;
    }
    pDVar2 = (pDVar7->next).field_0.p;
    if ((pDVar2 != (DRunningScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0)) {
      (pDVar7->next).field_0.p = (DRunningScript *)0x0;
      pDVar2 = (DRunningScript *)0x0;
    }
    while (pDVar7 = pDVar2, bVar8 = pDVar7 == (DRunningScript *)0x0, !bVar8) {
      if ((pDVar7 != script) && (((pDVar7->script).field_0.p)->scriptnum == script->wait_data)) {
        return false;
      }
      pDVar2 = (pDVar7->next).field_0.p;
      if ((pDVar2 != (DRunningScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0))
      {
        (pDVar7->next).field_0.p = (DRunningScript *)0x0;
        pDVar2 = (DRunningScript *)0x0;
      }
    }
    break;
  case 4:
    pDVar7 = (this->RunningScripts).field_0.p;
    if ((pDVar7 != (DRunningScript *)0x0) && (((pDVar7->super_DObject).ObjectFlags & 0x20) != 0)) {
      (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
      pDVar7 = (DRunningScript *)0x0;
    }
    pDVar2 = (pDVar7->next).field_0.p;
    if ((pDVar2 != (DRunningScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0)) {
      (pDVar7->next).field_0.p = (DRunningScript *)0x0;
      pDVar2 = (DRunningScript *)0x0;
    }
    while (pDVar7 = pDVar2, bVar8 = pDVar7 != (DRunningScript *)0x0, bVar8) {
      if ((pDVar7 != script) && (((pDVar7->script).field_0.p)->scriptnum == script->wait_data))
      goto switchD_0068a4f0_default;
      pDVar2 = (pDVar7->next).field_0.p;
      if ((pDVar2 != (DRunningScript *)0x0) && (((pDVar2->super_DObject).ObjectFlags & 0x20) != 0))
      {
        (pDVar7->next).field_0.p = (DRunningScript *)0x0;
        pDVar2 = (DRunningScript *)0x0;
      }
    }
    break;
  default:
switchD_0068a4f0_default:
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool DFraggleThinker::wait_finished(DRunningScript *script)
{
	switch(script->wait_type)
    {
    case wt_none: return true;        // uh? hehe
    case wt_scriptwait:               // waiting for script to finish
		{
			DRunningScript *current;
			for(current = RunningScripts->next; current; current = current->next)
			{
				if(current == script) continue;  // ignore this script
				if(current->script->scriptnum == script->wait_data)
					return false;        // script still running
			}
			return true;        // can continue now
		}
		
    case wt_delay:                          // just count down
		{
			return --script->wait_data <= 0;
		}
		
    case wt_tagwait:
		{
			int secnum;
			FSectorTagIterator itr(script->wait_data);
			while ((secnum = itr.Next()) >= 0)
			{
				sector_t *sec = &sectors[secnum];
				if(sec->floordata || sec->ceilingdata || sec->lightingdata)
					return false;        // not finished
			}
			return true;
		}
		
    case wt_scriptwaitpre: // haleyjd - wait for script to start
		{
			DRunningScript *current;
			for(current = RunningScripts->next; current; current=current->next)
			{
				if(current == script) continue;  // ignore this script
				if(current->script->scriptnum == script->wait_data)
					return true;        // script is now running
			}
			return false; // no running instances found
		}
		
    default: return true;
    }
	
	return false;
}